

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_types.cpp
# Opt level: O1

void duckdb::DuckDBTypesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  LogicalType *type;
  PhysicalType type_00;
  GlobalTableFunctionState *pGVar1;
  TypeCatalogEntry *pTVar2;
  pointer pcVar3;
  SchemaCatalogEntry *pSVar4;
  _func_int *p_Var5;
  uint uVar6;
  reference pvVar7;
  string *psVar8;
  idx_t iVar9;
  long lVar10;
  _func_int *p_Var11;
  char *pcVar12;
  Vector *pVVar13;
  ulong uVar14;
  _func_int **__n;
  _func_int *p_Var15;
  ulong index;
  string_t *__args;
  bool bVar16;
  string category;
  vector<duckdb::Value,_true> labels;
  __hashtable *__h;
  Value oid_val;
  ulong local_250;
  undefined1 *local_248;
  long local_240;
  undefined1 local_238 [16];
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_228;
  _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_208;
  vector<std::reference_wrapper<duckdb::TypeCatalogEntry>,_true> *local_200;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  Value local_178;
  _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_138 [8];
  LogicalType local_f8;
  string local_e0;
  LogicalType local_c0;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_a8 [24];
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  if (pGVar1[4]._vptr_GlobalTableFunctionState <
      (_func_int **)
      ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
       (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3)) {
    __n = pGVar1[4]._vptr_GlobalTableFunctionState;
    if (__n < (_func_int **)
              ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
               (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3)) {
      local_200 = (vector<std::reference_wrapper<duckdb::TypeCatalogEntry>,_true> *)(pGVar1 + 1);
      local_208 = (_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   *)(pGVar1 + 5);
      index = 0;
      do {
        pGVar1[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
        pvVar7 = vector<std::reference_wrapper<duckdb::TypeCatalogEntry>,_true>::operator[]
                           (local_200,(size_type)__n);
        pTVar2 = pvVar7->_M_data;
        psVar8 = Catalog::GetName_abi_cxx11_
                           ((pTVar2->super_StandardEntry).super_InCatalogEntry.catalog);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        pcVar3 = (psVar8->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,pcVar3,pcVar3 + psVar8->_M_string_length);
        Value::Value(&local_178,&local_198);
        DataChunk::SetValue(output,0,index,&local_178);
        Value::~Value(&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        iVar9 = Catalog::GetOid((pTVar2->super_StandardEntry).super_InCatalogEntry.catalog);
        lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar9);
        Value::BIGINT(&local_178,lVar10);
        DataChunk::SetValue(output,1,index,&local_178);
        Value::~Value(&local_178);
        pSVar4 = (pTVar2->super_StandardEntry).schema;
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        pcVar3 = (pSVar4->super_InCatalogEntry).super_CatalogEntry.name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar3,
                   pcVar3 + (pSVar4->super_InCatalogEntry).super_CatalogEntry.name._M_string_length)
        ;
        Value::Value(&local_178,&local_1b8);
        DataChunk::SetValue(output,2,index,&local_178);
        Value::~Value(&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                           ((((pTVar2->super_StandardEntry).schema)->super_InCatalogEntry).
                            super_CatalogEntry.oid);
        Value::BIGINT(&local_178,lVar10);
        DataChunk::SetValue(output,3,index,&local_178);
        type = &pTVar2->user_type;
        Value::~Value(&local_178);
        if ((pTVar2->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.internal == true)
        {
          local_250 = (ulong)type->id_;
        }
        else {
          local_250 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                                ((pTVar2->super_StandardEntry).super_InCatalogEntry.
                                 super_CatalogEntry.oid);
        }
        LogicalType::LogicalType(&local_48,SQLNULL);
        Value::Value(&local_178,&local_48);
        LogicalType::~LogicalType(&local_48);
        uVar14 = local_250 % (ulong)pGVar1[6]._vptr_GlobalTableFunctionState;
        p_Var5 = pGVar1[5]._vptr_GlobalTableFunctionState[uVar14];
        p_Var11 = (_func_int *)0x0;
        if ((p_Var5 != (_func_int *)0x0) &&
           (p_Var11 = p_Var5, p_Var15 = *(_func_int **)p_Var5,
           local_250 != *(ulong *)(*(_func_int **)p_Var5 + 8))) {
          while (p_Var5 = *(_func_int **)p_Var15, p_Var5 != (_func_int *)0x0) {
            p_Var11 = (_func_int *)0x0;
            if ((*(ulong *)(p_Var5 + 8) % (ulong)pGVar1[6]._vptr_GlobalTableFunctionState != uVar14)
               || (p_Var11 = p_Var15, p_Var15 = p_Var5, local_250 == *(ulong *)(p_Var5 + 8)))
            goto LAB_0152aa59;
          }
          p_Var11 = (_func_int *)0x0;
        }
LAB_0152aa59:
        if ((p_Var11 == (_func_int *)0x0) || (*(long *)p_Var11 == 0)) {
          local_138[0] = local_208;
          ::std::
          _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                    (local_208,&local_250,(Value *)local_138);
          Value::BIGINT((Value *)local_138,local_250);
          Value::operator=(&local_178,(Value *)local_138);
          Value::~Value((Value *)local_138);
        }
        else {
          LogicalType::LogicalType(&local_60,SQLNULL);
          Value::Value((Value *)local_138,&local_60);
          Value::operator=(&local_178,(Value *)local_138);
          Value::~Value((Value *)local_138);
          LogicalType::~LogicalType(&local_60);
        }
        DataChunk::SetValue(output,4,index,&local_178);
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        pcVar3 = (pTVar2->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                 _M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,pcVar3,
                   pcVar3 + (pTVar2->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                            name._M_string_length);
        Value::Value((Value *)local_138,&local_1d8);
        DataChunk::SetValue(output,5,index,(Value *)local_138);
        Value::~Value((Value *)local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        type_00 = (pTVar2->user_type).physical_type_;
        if (type_00 == INVALID) {
          LogicalType::LogicalType(&local_78,SQLNULL);
          Value::Value((Value *)local_138,&local_78);
        }
        else {
          iVar9 = GetTypeIdSize(type_00);
          lVar10 = NumericCastImpl<long,_unsigned_long,_false>::Convert(iVar9);
          Value::BIGINT((Value *)local_138,lVar10);
        }
        DataChunk::SetValue(output,6,index,(Value *)local_138);
        Value::~Value((Value *)local_138);
        if (type_00 == INVALID) {
          LogicalType::~LogicalType(&local_78);
        }
        pcVar12 = EnumUtil::ToChars<duckdb::LogicalTypeId>(type->id_);
        ::std::__cxx11::string::string((string *)&local_e0,pcVar12,(allocator *)&local_248);
        Value::Value((Value *)local_138,&local_e0);
        DataChunk::SetValue(output,7,index,(Value *)local_138);
        Value::~Value((Value *)local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        local_248 = local_238;
        local_240 = 0;
        local_238[0] = 0;
        switch(type->id_) {
        case BOOLEAN:
          pcVar12 = "BOOLEAN";
          break;
        case TINYINT:
        case SMALLINT:
        case INTEGER:
        case BIGINT:
        case DECIMAL:
        case FLOAT:
        case DOUBLE:
        case UTINYINT:
        case USMALLINT:
        case UINTEGER:
        case UBIGINT:
        case UHUGEINT:
        case HUGEINT:
          pcVar12 = "NUMERIC";
          break;
        case DATE:
        case TIME:
        case TIMESTAMP_SEC:
        case TIMESTAMP_MS:
        case TIMESTAMP:
        case TIMESTAMP_NS:
        case INTERVAL:
        case TIMESTAMP_TZ:
        case TIME_TZ:
          pcVar12 = "DATETIME";
          break;
        case CHAR:
        case VARCHAR:
          pcVar12 = "STRING";
          break;
        case BLOB:
        case TIMESTAMP_TZ|SQLNULL:
        case TIME_TZ|SQLNULL:
        case BIT:
        case STRING_LITERAL:
        case INTEGER_LITERAL:
        case VARINT:
        case 0x28:
        case 0x29:
        case TIMESTAMP_TZ|BOOLEAN:
        case TIMESTAMP_TZ|TINYINT:
        case TIMESTAMP_TZ|SMALLINT:
        case TIMESTAMP_TZ|INTEGER:
        case TIMESTAMP_TZ|BIGINT:
        case TIMESTAMP_TZ|DATE:
        case TIMESTAMP_TZ|TIME:
          goto switchD_0152ac76_caseD_1a;
        default:
          uVar6 = type->id_ - 100;
          if ((uVar6 < 8) && ((0x87U >> (uVar6 & 0x1f) & 1) != 0)) {
            pcVar12 = "COMPOSITE";
            break;
          }
          goto switchD_0152ac76_caseD_1a;
        }
        ::std::__cxx11::string::_M_replace((ulong)&local_248,0,(char *)0x0,(ulong)pcVar12);
switchD_0152ac76_caseD_1a:
        lVar10 = local_240;
        if (local_240 == 0) {
          LogicalType::LogicalType(&local_90,SQLNULL);
          Value::Value((Value *)local_138,&local_90);
        }
        else {
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,local_248,local_248 + local_240);
          Value::Value((Value *)local_138,&local_1f8);
        }
        DataChunk::SetValue(output,8,index,(Value *)local_138);
        Value::~Value((Value *)local_138);
        if (lVar10 == 0) {
          LogicalType::~LogicalType(&local_90);
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        Value::Value((Value *)local_138,
                     &(pTVar2->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment)
        ;
        DataChunk::SetValue(output,9,index,(Value *)local_138);
        Value::~Value((Value *)local_138);
        Value::MAP((Value *)local_138,
                   &(pTVar2->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.tags);
        DataChunk::SetValue(output,10,index,(Value *)local_138);
        Value::~Value((Value *)local_138);
        Value::BOOLEAN((Value *)local_138,
                       (pTVar2->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                       internal);
        DataChunk::SetValue(output,0xb,index,(Value *)local_138);
        Value::~Value((Value *)local_138);
        if ((type->id_ == ENUM) &&
           ((pTVar2->user_type).type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0)) {
          pVVar13 = EnumType::GetValuesInsertOrder(type);
          __args = (string_t *)pVVar13->data;
          iVar9 = EnumType::GetSize(type);
          local_228.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_228.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_228.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (; iVar9 != 0; iVar9 = iVar9 - 1) {
            ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
            emplace_back<duckdb::string_t_const&>
                      ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_228,__args);
            __args = __args + 1;
          }
          LogicalType::LogicalType(&local_f8,VARCHAR);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(local_a8,&local_228);
          Value::LIST((Value *)local_138,&local_f8,(vector<duckdb::Value,_true> *)local_a8);
          DataChunk::SetValue(output,0xc,index,(Value *)local_138);
          Value::~Value((Value *)local_138);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_a8);
          LogicalType::~LogicalType(&local_f8);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_228);
        }
        else {
          LogicalType::LogicalType(&local_c0,SQLNULL);
          Value::Value((Value *)local_138,&local_c0);
          DataChunk::SetValue(output,0xc,index,(Value *)local_138);
          Value::~Value((Value *)local_138);
          LogicalType::~LogicalType(&local_c0);
        }
        if (local_248 != local_238) {
          operator_delete(local_248);
        }
        iVar9 = index + 1;
        Value::~Value(&local_178);
        __n = pGVar1[4]._vptr_GlobalTableFunctionState;
      } while ((__n < (_func_int **)
                      ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
                       (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3)) &&
              (bVar16 = index < 0x7ff, index = iVar9, bVar16));
    }
    else {
      iVar9 = 0;
    }
    output->count = iVar9;
  }
  return;
}

Assistant:

void DuckDBTypesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBTypesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &type_entry = data.entries[data.offset++].get();
		auto &type = type_entry.user_type;

		// return values:
		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, count, type_entry.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(type_entry.catalog.GetOid())));
		// schema_name, LogicalType::VARCHAR
		output.SetValue(col++, count, Value(type_entry.schema.name));
		// schema_oid, LogicalType::BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(type_entry.schema.oid)));
		// type_oid, BIGINT
		int64_t oid;
		if (type_entry.internal) {
			oid = NumericCast<int64_t>(type.id());
		} else {
			oid = NumericCast<int64_t>(type_entry.oid);
		}
		Value oid_val;
		if (data.oids.find(oid) == data.oids.end()) {
			data.oids.insert(oid);
			oid_val = Value::BIGINT(oid);
		} else {
			oid_val = Value();
		}
		output.SetValue(col++, count, oid_val);
		// type_name, VARCHAR
		output.SetValue(col++, count, Value(type_entry.name));
		// type_size, BIGINT
		auto internal_type = type.InternalType();
		output.SetValue(col++, count,
		                internal_type == PhysicalType::INVALID
		                    ? Value()
		                    : Value::BIGINT(NumericCast<int64_t>(GetTypeIdSize(internal_type))));
		// logical_type, VARCHAR
		output.SetValue(col++, count, Value(EnumUtil::ToString(type.id())));
		// type_category, VARCHAR
		string category;
		switch (type.id()) {
		case LogicalTypeId::TINYINT:
		case LogicalTypeId::SMALLINT:
		case LogicalTypeId::INTEGER:
		case LogicalTypeId::BIGINT:
		case LogicalTypeId::DECIMAL:
		case LogicalTypeId::FLOAT:
		case LogicalTypeId::DOUBLE:
		case LogicalTypeId::UTINYINT:
		case LogicalTypeId::USMALLINT:
		case LogicalTypeId::UINTEGER:
		case LogicalTypeId::UBIGINT:
		case LogicalTypeId::HUGEINT:
		case LogicalTypeId::UHUGEINT:
			category = "NUMERIC";
			break;
		case LogicalTypeId::DATE:
		case LogicalTypeId::TIME:
		case LogicalTypeId::TIMESTAMP_SEC:
		case LogicalTypeId::TIMESTAMP_MS:
		case LogicalTypeId::TIMESTAMP:
		case LogicalTypeId::TIMESTAMP_NS:
		case LogicalTypeId::INTERVAL:
		case LogicalTypeId::TIME_TZ:
		case LogicalTypeId::TIMESTAMP_TZ:
			category = "DATETIME";
			break;
		case LogicalTypeId::CHAR:
		case LogicalTypeId::VARCHAR:
			category = "STRING";
			break;
		case LogicalTypeId::BOOLEAN:
			category = "BOOLEAN";
			break;
		case LogicalTypeId::STRUCT:
		case LogicalTypeId::LIST:
		case LogicalTypeId::MAP:
		case LogicalTypeId::UNION:
			category = "COMPOSITE";
			break;
		default:
			break;
		}
		output.SetValue(col++, count, category.empty() ? Value() : Value(category));
		// comment, VARCHAR
		output.SetValue(col++, count, Value(type_entry.comment));
		// tags, MAP
		output.SetValue(col++, count, Value::MAP(type_entry.tags));
		// internal, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(type_entry.internal));
		// labels, VARCHAR[]
		if (type.id() == LogicalTypeId::ENUM && type.AuxInfo()) {
			auto data = FlatVector::GetData<string_t>(EnumType::GetValuesInsertOrder(type));
			idx_t size = EnumType::GetSize(type);

			vector<Value> labels;
			for (idx_t i = 0; i < size; i++) {
				labels.emplace_back(data[i]);
			}

			output.SetValue(col++, count, Value::LIST(LogicalType::VARCHAR, labels));
		} else {
			output.SetValue(col++, count, Value());
		}

		count++;
	}
	output.SetCardinality(count);
}